

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.h
# Opt level: O0

uint8_t winmd::reader::database::
        composite_index_size<winmd::reader::table<winmd::reader::Field>,winmd::reader::table<winmd::reader::Param>,winmd::reader::table<winmd::reader::Property>>
                  (table<winmd::reader::Field> *tables,table<winmd::reader::Param> *tables_1,
                  table<winmd::reader::Property> *tables_2)

{
  uint8_t uVar1;
  bool bVar2;
  uint32_t uVar3;
  undefined1 local_29;
  undefined1 local_21;
  table<winmd::reader::Property> *tables_local_2;
  table<winmd::reader::Param> *tables_local_1;
  table<winmd::reader::Field> *tables_local;
  
  uVar3 = table_base::size(&tables->super_table_base);
  uVar1 = impl::bits_needed(3);
  bVar2 = composite_index_size(uVar3,uVar1);
  local_21 = false;
  if (bVar2) {
    uVar3 = table_base::size(&tables_1->super_table_base);
    uVar1 = impl::bits_needed(3);
    bVar2 = composite_index_size(uVar3,uVar1);
    local_29 = false;
    if (bVar2) {
      uVar3 = table_base::size(&tables_2->super_table_base);
      uVar1 = impl::bits_needed(3);
      local_29 = composite_index_size(uVar3,uVar1);
    }
    local_21 = local_29;
  }
  uVar1 = '\x04';
  if (local_21 != false) {
    uVar1 = '\x02';
  }
  return uVar1;
}

Assistant:

static uint8_t composite_index_size(Tables const&... tables)
        {
            return (composite_index_size(tables.size(), impl::bits_needed(sizeof...(tables))) && ...) ? 2 : 4;
        }